

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_registerArchiver(PHYSFS_Archiver *archiver)

{
  int retval;
  PHYSFS_Archiver *archiver_local;
  
  if (initialized == 0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_NOT_INITIALIZED);
    archiver_local._4_4_ = 0;
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    archiver_local._4_4_ = doRegisterArchiver(archiver);
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return archiver_local._4_4_;
}

Assistant:

int PHYSFS_registerArchiver(const PHYSFS_Archiver *archiver)
{
    int retval;
    BAIL_IF(!initialized, PHYSFS_ERR_NOT_INITIALIZED, 0);
    __PHYSFS_platformGrabMutex(stateLock);
    retval = doRegisterArchiver(archiver);
    __PHYSFS_platformReleaseMutex(stateLock);
    return retval;
}